

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_server.cpp
# Opt level: O0

variant<std::vector<lscpp::protocol::CompletionItem,_std::allocator<lscpp::protocol::CompletionItem>_>_>
* __thiscall
lscpp::my_lsp_server::completion
          (variant<std::vector<lscpp::protocol::CompletionItem,_std::allocator<lscpp::protocol::CompletionItem>_>_>
           *__return_storage_ptr__,my_lsp_server *this,CompletionParams *params)

{
  initializer_list<lscpp::protocol::CompletionItem> __l;
  Verbosity VVar1;
  double __x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  allocator<lscpp::protocol::CompletionItem> local_7d [13];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  size_type local_40;
  vector<lscpp::protocol::CompletionItem,_std::allocator<lscpp::protocol::CompletionItem>_> local_38
  ;
  CompletionParams *local_20;
  CompletionParams *params_local;
  my_lsp_server *this_local;
  
  local_20 = params;
  params_local = (CompletionParams *)this;
  this_local = (my_lsp_server *)__return_storage_ptr__;
  VVar1 = loguru::current_verbosity_cutoff();
  if (-1 < VVar1) {
    loguru::log(__x);
  }
  this->counter = this->counter + 1;
  local_70 = &local_68;
  std::operator+(local_70,"bla",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)params);
  local_48 = &local_68;
  local_40 = 1;
  std::allocator<lscpp::protocol::CompletionItem>::allocator(local_7d);
  __l._M_len = local_40;
  __l._M_array = (iterator)local_48;
  std::vector<lscpp::protocol::CompletionItem,_std::allocator<lscpp::protocol::CompletionItem>_>::
  vector(&local_38,__l,local_7d);
  std::
  variant<std::vector<lscpp::protocol::CompletionItem,std::allocator<lscpp::protocol::CompletionItem>>>
  ::
  variant<std::vector<lscpp::protocol::CompletionItem,std::allocator<lscpp::protocol::CompletionItem>>,void,void,std::vector<lscpp::protocol::CompletionItem,std::allocator<lscpp::protocol::CompletionItem>>,void>
            ((variant<std::vector<lscpp::protocol::CompletionItem,std::allocator<lscpp::protocol::CompletionItem>>>
              *)__return_storage_ptr__,&local_38);
  std::vector<lscpp::protocol::CompletionItem,_std::allocator<lscpp::protocol::CompletionItem>_>::
  ~vector(&local_38);
  std::allocator<lscpp::protocol::CompletionItem>::~allocator(local_7d);
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48;
  do {
    local_b0 = local_b0 + -1;
    protocol::CompletionItem::~CompletionItem((CompletionItem *)local_b0);
  } while (local_b0 != &local_68);
  return __return_storage_ptr__;
}

Assistant:

std::variant<std::vector<protocol::CompletionItem>>
  completion(protocol::CompletionParams params) override {
    LOG_F(INFO, "In sample_server2: completion");
    counter++;
    return std::vector<protocol::CompletionItem>{
        {"bla" + params.textDocument.uri}};
  }